

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManifestTest.cpp
# Opt level: O0

void __thiscall
ManifestTest_normalize_path_randomized_Test::TestBody
          (ManifestTest_normalize_path_randomized_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference __x;
  undefined8 uVar4;
  char *pcVar5;
  char *in_R9;
  StringRef SVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  string local_2e0;
  AssertHelper local_2c0;
  Message local_2b8;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_;
  Message local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  string local_278;
  string local_258;
  allocator local_231;
  string local_230;
  string local_210;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar;
  StringRef local_1d8;
  size_t local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  reference local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *component;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string path;
  int i;
  int length;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pathComponents;
  int n;
  bool atLeastOneTested;
  type componentIndexDice;
  type lengthDice;
  uniform_int_distribution<int> componentDistribution;
  uniform_int_distribution<int> lengthDistribution;
  default_random_engine generator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string asStack_d0 [32];
  string asStack_b0 [32];
  string asStack_90 [32];
  string asStack_70 [32];
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  componentVariants;
  ManifestTest_normalize_path_randomized_Test *this_local;
  
  componentVariants.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"",(allocator *)((long)&generator._M_x + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_d0,".",(allocator *)((long)&generator._M_x + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_b0,"..",(allocator *)((long)&generator._M_x + 5));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_90,"a",(allocator *)((long)&generator._M_x + 4));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_70,"b",(allocator *)((long)&generator._M_x + 3));
  local_50 = &local_f0;
  local_48 = 5;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&generator._M_x + 2));
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40,__l,(allocator_type *)((long)&generator._M_x + 2));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&generator._M_x + 2));
  local_2e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50;
  do {
    local_2e8 = local_2e8 + -1;
    std::__cxx11::string::~string((string *)local_2e8);
  } while (local_2e8 != &local_f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&generator._M_x + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&generator._M_x + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&generator._M_x + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&generator._M_x + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&generator._M_x + 7));
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &lengthDistribution);
  std::uniform_int_distribution<int>::uniform_int_distribution(&componentDistribution,1,5);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&lengthDice._M_bound_args,0,(int)sVar3 + -1);
  std::
  bind<std::uniform_int_distribution<int>&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
            ((uniform_int_distribution<int> *)&componentIndexDice._M_bound_args,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &componentDistribution);
  std::
  bind<std::uniform_int_distribution<int>&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
            ((uniform_int_distribution<int> *)&n,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &lengthDice._M_bound_args);
  pathComponents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  for (pathComponents.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      (int)pathComponents.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < 1000;
      pathComponents.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)pathComponents.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i);
    path.field_2._12_4_ =
         std::
         _Bind<std::uniform_int_distribution<int>(std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>)>
         ::operator()((_Bind<std::uniform_int_distribution<int>(std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>)>
                       *)&componentIndexDice._M_bound_args);
    for (path.field_2._8_4_ = 0; (int)path.field_2._8_4_ < (int)path.field_2._12_4_;
        path.field_2._8_4_ = path.field_2._8_4_ + 1) {
      iVar2 = std::
              _Bind<std::uniform_int_distribution<int>(std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>)>
              ::operator()((_Bind<std::uniform_int_distribution<int>(std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>)>
                            *)&n);
      __x = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_40,(long)iVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i,__x);
    }
    std::__cxx11::string::string((string *)&__range2);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i);
    component = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&i);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&component), bVar1) {
      local_198 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      std::operator+(&local_1b8,"/",local_198);
      std::__cxx11::string::operator+=((string *)&__range2,(string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    uVar4 = std::__cxx11::string::data();
    local_1d8.Data = (char *)uVar4;
    uVar4 = std::__cxx11::string::length();
    local_1d8.Length = uVar4;
    SVar6 = llvm::sys::path::root_name(local_1d8,native);
    local_1c0 = SVar6.Length;
    if (local_1c0 == 0) {
      pathComponents.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_230,"/",&local_231);
      std::__cxx11::string::string((string *)&local_258,(string *)&__range2);
      normalize(&local_210,&local_230,&local_258);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_290,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i);
      normalize_path_model(&local_278,&local_290);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((EqHelper *)local_1f0,"normalize(\"/\", path)",
                 "normalize_path_model(pathComponents)",&local_210,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_290);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
      if (!bVar1) {
        testing::Message::Message(&local_298);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
                   ,0xde,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_298);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
        testing::Message::~Message(&local_298);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
    else {
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 4;
    }
    std::__cxx11::string::~string((string *)&__range2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
  }
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b0,
             (bool *)((long)&pathComponents.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2e0,(internal *)local_2b0,(AssertionResult *)"atLeastOneTested","false","true"
               ,in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0xe1,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    testing::Message::~Message(&local_2b8);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return;
}

Assistant:

TEST(ManifestTest, normalize_path_randomized) {
  const std::vector<std::string> componentVariants = { "", ".", "..", "a", "b" };

  std::default_random_engine generator;
  std::uniform_int_distribution<int> lengthDistribution(1, 5);
  std::uniform_int_distribution<int> componentDistribution(0, componentVariants.size() - 1);

  auto lengthDice = std::bind(lengthDistribution, generator);
  auto componentIndexDice = std::bind(componentDistribution, generator);

  bool atLeastOneTested = true;

  for (int n = 1; n < 1000; n++) {
    std::vector<std::string> pathComponents;
    const int length = lengthDice();

    for (int i = 0; i < length; i++) {
      pathComponents.push_back(componentVariants[componentIndexDice()]);
    }


    std::string path;
    for (auto &component : pathComponents) {
        path += "/" + component;
    }

    // Ignore path names with "network" prefixes, such as "//net".
    if (llvm::sys::path::root_name(path).size() != 0) {
      continue;
    } else {
      // Make sure we didn't ignore all test paths.
      atLeastOneTested = true;
    }

    EXPECT_EQ(normalize("/", path), normalize_path_model(pathComponents));
  }

  ASSERT_TRUE(atLeastOneTested);
}